

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_get_tile_descriptor
          (exr_const_context_t ctxt,int part_index,uint32_t *xsize,uint32_t *ysize,
          exr_tile_level_mode_t *level,exr_tile_round_mode_t *round)

{
  _internal_exr_part *p_Var1;
  exr_attr_tiledesc_t *peVar2;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  uint *in_R8;
  int *in_R9;
  exr_attr_tiledesc_t *out;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (p_Var1->tiles == (exr_attribute_t *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = 0xf;
      }
      else {
        peVar2 = (p_Var1->tiles->field_6).tiledesc;
        if (p_Var1->tiles->type == EXR_ATTR_TILEDESC) {
          if (in_RDX != (uint32_t *)0x0) {
            *in_RDX = peVar2->x_size;
          }
          if (in_RCX != (uint32_t *)0x0) {
            *in_RCX = peVar2->y_size;
          }
          if (in_R8 != (uint *)0x0) {
            *in_R8 = peVar2->level_and_round & 0xf;
          }
          if (in_R9 != (int *)0x0) {
            *in_R9 = (int)(uint)peVar2->level_and_round >> 4;
          }
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          local_4 = 0;
        }
        else {
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          local_4 = (*in_RDI->print_error)
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'tiles\'",
                               p_Var1->tiles->type_name);
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_tile_descriptor (
    exr_const_context_t    ctxt,
    int                    part_index,
    uint32_t*              xsize,
    uint32_t*              ysize,
    exr_tile_level_mode_t* level,
    exr_tile_round_mode_t* round)
{
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->tiles)
    {
        const exr_attr_tiledesc_t* out = part->tiles->tiledesc;

        if (part->tiles->type != EXR_ATTR_TILEDESC)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'tiles'",
                part->tiles->type_name));

        if (xsize) *xsize = out->x_size;
        if (ysize) *ysize = out->y_size;
        if (level) *level = EXR_GET_TILE_LEVEL_MODE (*out);
        if (round) *round = EXR_GET_TILE_ROUND_MODE (*out);
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_NO_ATTR_BY_NAME);
}